

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmisc.c
# Opt level: O3

int quorem_D2A(Bigint *b,Bigint *S)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ULong *pUVar8;
  ULong *pUVar9;
  ulong uVar10;
  ulong uVar11;
  ULong *pUVar12;
  ULong *pUVar13;
  uint uVar14;
  ulong uVar15;
  ULong *pUVar16;
  
  iVar3 = S->wds;
  lVar7 = (long)iVar3;
  iVar5 = 0;
  if (iVar3 <= b->wds) {
    pUVar16 = S->x;
    uVar15 = lVar7 - 1;
    pUVar12 = S->x + lVar7 + -1;
    pUVar13 = b->x;
    uVar2 = (ulong)b->x[lVar7 + -1] / (ulong)(*pUVar12 + 1);
    iVar5 = (int)uVar2;
    if (*pUVar12 + 1 <= b->x[lVar7 + -1]) {
      lVar6 = 0;
      uVar10 = 0;
      pUVar8 = pUVar13;
      pUVar9 = pUVar16;
      do {
        uVar14 = *pUVar9;
        pUVar9 = pUVar9 + 1;
        uVar11 = uVar14 * uVar2 + uVar10;
        uVar10 = uVar11 >> 0x20;
        lVar4 = ((ulong)*pUVar8 - (uVar11 & 0xffffffff)) + lVar6;
        lVar6 = lVar4 >> 0x20;
        *pUVar8 = (uint)lVar4;
        pUVar8 = pUVar8 + 1;
      } while (pUVar9 <= pUVar12);
      if (b->x[lVar7 + -1] == 0) {
        if (2 < iVar3) {
          lVar7 = lVar7 * 4 + 0x14;
          do {
            if (*(int *)((long)b->x + lVar7 + -0x1c) != 0) break;
            uVar15 = (ulong)((int)uVar15 - 1);
            lVar7 = lVar7 + -4;
          } while (0x1c < lVar7);
        }
        b->wds = (int)uVar15;
      }
    }
    uVar14 = (uint)uVar15;
    iVar3 = cmp_D2A(b,S);
    if (-1 < iVar3) {
      lVar7 = 0;
      do {
        uVar1 = *pUVar16;
        pUVar16 = pUVar16 + 1;
        lVar6 = ((ulong)*pUVar13 - (ulong)uVar1) + lVar7;
        lVar7 = lVar6 >> 0x20;
        *pUVar13 = (uint)lVar6;
        pUVar13 = pUVar13 + 1;
      } while (pUVar16 <= pUVar12);
      iVar5 = iVar5 + 1;
      if (b->x[(int)uVar14] == 0) {
        if (1 < (int)uVar14) {
          lVar7 = (long)(int)uVar14 * 4 + 0x18;
          do {
            uVar14 = (uint)uVar15;
            if (*(int *)((long)b->x + lVar7 + -0x1c) != 0) break;
            uVar14 = uVar14 - 1;
            uVar15 = (ulong)uVar14;
            lVar7 = lVar7 + -4;
          } while (0x1c < lVar7);
        }
        b->wds = uVar14;
      }
    }
  }
  return iVar5;
}

Assistant:

int
quorem
#ifdef KR_headers
	(b, S) Bigint *b, *S;
#else
	(Bigint *b, Bigint *S)
#endif
{
	int n;
	ULong *bx, *bxe, q, *sx, *sxe;
#ifdef ULLong
	ULLong borrow, carry, y, ys;
#else
	ULong borrow, carry, y, ys;
#ifdef Pack_32
	ULong si, z, zs;
#endif
#endif

	n = S->wds;
#ifdef DEBUG
	/*debug*/ if (b->wds > n)
	/*debug*/	Bug("oversize b in quorem");
#endif
	if (b->wds < n)
		return 0;
	sx = S->x;
	sxe = sx + --n;
	bx = b->x;
	bxe = bx + n;
	q = *bxe / (*sxe + 1);	/* ensure q <= true quotient */
#ifdef DEBUG
	/*debug*/ if (q > 9)
	/*debug*/	Bug("oversized quotient in quorem");
#endif
	if (q) {
		borrow = 0;
		carry = 0;
		do {
#ifdef ULLong
			ys = *sx++ * (ULLong)q + carry;
			carry = ys >> 32;
			y = *bx - (ys & 0xffffffffUL) - borrow;
			borrow = y >> 32 & 1UL;
			*bx++ = (ULong)(y & 0xffffffffUL);
#else
#ifdef Pack_32
			si = *sx++;
			ys = (si & 0xffff) * q + carry;
			zs = (si >> 16) * q + (ys >> 16);
			carry = zs >> 16;
			y = (*bx & 0xffff) - (ys & 0xffff) - borrow;
			borrow = (y & 0x10000) >> 16;
			z = (*bx >> 16) - (zs & 0xffff) - borrow;
			borrow = (z & 0x10000) >> 16;
			Storeinc(bx, z, y);
#else
			ys = *sx++ * q + carry;
			carry = ys >> 16;
			y = *bx - (ys & 0xffff) - borrow;
			borrow = (y & 0x10000) >> 16;
			*bx++ = y & 0xffff;
#endif
#endif
			}
			while(sx <= sxe);
		if (!*bxe) {
			bx = b->x;
			while(--bxe > bx && !*bxe)
				--n;
			b->wds = n;
			}
		}
	if (cmp(b, S) >= 0) {
		q++;
		borrow = 0;
		carry = 0;
		bx = b->x;
		sx = S->x;
		do {
#ifdef ULLong
			ys = *sx++ + carry;
			carry = ys >> 32;
			y = *bx - (ys & 0xffffffffUL) - borrow;
			borrow = y >> 32 & 1UL;
			*bx++ = (ULong)(y & 0xffffffffUL);
#else
#ifdef Pack_32
			si = *sx++;
			ys = (si & 0xffff) + carry;
			zs = (si >> 16) + (ys >> 16);
			carry = zs >> 16;
			y = (*bx & 0xffff) - (ys & 0xffff) - borrow;
			borrow = (y & 0x10000) >> 16;
			z = (*bx >> 16) - (zs & 0xffff) - borrow;
			borrow = (z & 0x10000) >> 16;
			Storeinc(bx, z, y);
#else
			ys = *sx++ + carry;
			carry = ys >> 16;
			y = *bx - (ys & 0xffff) - borrow;
			borrow = (y & 0x10000) >> 16;
			*bx++ = y & 0xffff;
#endif
#endif
			}
			while(sx <= sxe);
		bx = b->x;
		bxe = bx + n;
		if (!*bxe) {
			while(--bxe > bx && !*bxe)
				--n;
			b->wds = n;
			}
		}
	return q;
	}